

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_cache.cpp
# Opt level: O3

void multikey_cache<8u,false>(Cacheblock<8U>_conflict *cache,size_t N,size_t depth)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uchar *puVar3;
  uint64_t uVar4;
  uchar *puVar5;
  int iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  Cacheblock<8U>_conflict *pCVar12;
  Cacheblock<8U>_conflict *pCVar13;
  ulong uVar14;
  Cacheblock<8U>_conflict *pCVar15;
  byte bVar16;
  ulong uVar17;
  uint64_t uVar18;
  Cacheblock<8U>_conflict *pCVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  Cacheblock<8U>_conflict __tmp;
  
  if (0x1f < N) {
    uVar11 = N >> 3;
    uVar10 = cache->cached_bytes;
    uVar24 = cache[uVar11].cached_bytes;
    pCVar12 = cache;
    if (uVar10 != uVar24) {
      pCVar12 = cache + (N >> 2);
      uVar22 = pCVar12->cached_bytes;
      if ((uVar22 != uVar10) && (uVar22 != uVar24)) {
        if (uVar10 < uVar24) {
          if (uVar22 <= uVar10) {
            pCVar12 = cache;
          }
          if (uVar24 < uVar22) {
            pCVar12 = cache + uVar11;
          }
        }
        else {
          if (uVar10 < uVar22) {
            pCVar12 = cache;
          }
          if (uVar22 < uVar24) {
            pCVar12 = cache + uVar11;
          }
        }
      }
    }
    uVar22 = N >> 1;
    pCVar13 = cache + (uVar22 - uVar11);
    uVar10 = cache[uVar22 - uVar11].cached_bytes;
    uVar24 = cache[uVar22].cached_bytes;
    pCVar15 = pCVar13;
    if (uVar10 != uVar24) {
      pCVar19 = cache + uVar22;
      pCVar15 = pCVar19 + uVar11;
      uVar22 = pCVar15->cached_bytes;
      if ((uVar22 != uVar10) && (uVar22 != uVar24)) {
        if (uVar10 < uVar24) {
          if (uVar10 < uVar22) {
            pCVar13 = pCVar15;
          }
          pCVar15 = pCVar13;
          if (uVar24 < uVar22) {
            pCVar15 = pCVar19;
          }
        }
        else {
          if (uVar10 < uVar22) {
            pCVar15 = pCVar13;
          }
          if (uVar22 < uVar24) {
            pCVar15 = pCVar19;
          }
        }
      }
    }
    lVar20 = (N - (N >> 2)) + -1;
    pCVar13 = cache + lVar20;
    lVar21 = (N - uVar11) + -1;
    uVar10 = cache[lVar20].cached_bytes;
    uVar24 = cache[lVar21].cached_bytes;
    pCVar19 = pCVar13;
    if (uVar10 != uVar24) {
      pCVar19 = cache + (N - 3);
      uVar11 = pCVar19->cached_bytes;
      if ((uVar11 != uVar10) && (uVar11 != uVar24)) {
        if (uVar10 < uVar24) {
          if (uVar10 < uVar11) {
            pCVar13 = pCVar19;
          }
          pCVar19 = pCVar13;
          if (uVar24 < uVar11) {
            pCVar19 = cache + lVar21;
          }
        }
        else {
          if (uVar10 < uVar11) {
            pCVar19 = pCVar13;
          }
          if (uVar11 < uVar24) {
            pCVar19 = cache + lVar21;
          }
        }
      }
    }
    uVar10 = pCVar12->cached_bytes;
    uVar24 = pCVar15->cached_bytes;
    pCVar13 = pCVar12;
    if (((uVar10 != uVar24) && (uVar11 = pCVar19->cached_bytes, pCVar13 = pCVar19, uVar11 != uVar10)
        ) && (uVar11 != uVar24)) {
      if (uVar10 < uVar24) {
        if (uVar10 < uVar11) {
          pCVar12 = pCVar19;
        }
        pCVar13 = pCVar12;
        if (uVar24 < uVar11) {
          pCVar13 = pCVar15;
        }
      }
      else {
        if (uVar10 < uVar11) {
          pCVar19 = pCVar12;
        }
        pCVar13 = pCVar19;
        if (uVar11 < uVar24) {
          pCVar13 = pCVar15;
        }
      }
    }
    uVar17 = N - 1;
    uVar18 = cache->cached_bytes;
    puVar3 = cache->ptr;
    puVar5 = pCVar13->ptr;
    cache->cached_bytes = pCVar13->cached_bytes;
    cache->ptr = puVar5;
    pCVar13->cached_bytes = uVar18;
    pCVar13->ptr = puVar3;
    uVar11 = cache->cached_bytes;
    uVar10 = 1;
    uVar14 = 1;
    uVar22 = uVar17;
    uVar24 = uVar17;
    do {
      if (uVar14 <= uVar22) {
        pCVar12 = cache + uVar14;
        uVar26 = uVar10;
        do {
          uVar10 = uVar26;
          if (uVar11 < pCVar12->cached_bytes) break;
          if (uVar11 <= pCVar12->cached_bytes) {
            uVar10 = uVar26 + 1;
            uVar18 = cache[uVar26].cached_bytes;
            puVar3 = cache[uVar26].ptr;
            puVar5 = pCVar12->ptr;
            cache[uVar26].cached_bytes = pCVar12->cached_bytes;
            cache[uVar26].ptr = puVar5;
            pCVar12->cached_bytes = uVar18;
            pCVar12->ptr = puVar3;
          }
          uVar14 = uVar14 + 1;
          pCVar12 = pCVar12 + 1;
          uVar26 = uVar10;
        } while (uVar14 <= uVar22);
      }
      if (uVar14 <= uVar22) {
        pCVar12 = cache + uVar22;
        uVar26 = uVar24;
        do {
          uVar24 = uVar26;
          if (pCVar12->cached_bytes < uVar11) break;
          if (pCVar12->cached_bytes == uVar11) {
            uVar24 = uVar26 - 1;
            uVar18 = cache[uVar26].cached_bytes;
            puVar3 = cache[uVar26].ptr;
            puVar5 = pCVar12->ptr;
            cache[uVar26].cached_bytes = pCVar12->cached_bytes;
            cache[uVar26].ptr = puVar5;
            pCVar12->cached_bytes = uVar18;
            pCVar12->ptr = puVar3;
          }
          uVar22 = uVar22 - 1;
          pCVar12 = pCVar12 + -1;
          uVar26 = uVar24;
        } while (uVar14 <= uVar22);
      }
      if (uVar22 < uVar14) {
        uVar17 = uVar17 - uVar24;
        uVar26 = uVar14 - uVar10;
        uVar24 = uVar24 - uVar22;
        uVar22 = uVar10;
        if (uVar26 < uVar10) {
          uVar22 = uVar26;
        }
        if (uVar22 != 0) {
          lVar21 = 0;
          do {
            puVar1 = (undefined8 *)((long)&cache->cached_bytes + lVar21);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            puVar1 = (undefined8 *)((long)&cache[uVar14 - uVar22].cached_bytes + lVar21);
            uVar9 = puVar1[1];
            puVar2 = (undefined8 *)((long)&cache->cached_bytes + lVar21);
            *puVar2 = *puVar1;
            puVar2[1] = uVar9;
            puVar1 = (undefined8 *)((long)&cache[uVar14 - uVar22].cached_bytes + lVar21);
            *puVar1 = uVar7;
            puVar1[1] = uVar8;
            lVar21 = lVar21 + 0x10;
          } while (uVar22 * 0x10 != lVar21);
        }
        uVar22 = uVar17;
        if (uVar24 < uVar17) {
          uVar22 = uVar24;
        }
        if (uVar22 != 0) {
          lVar21 = 0;
          do {
            puVar1 = (undefined8 *)((long)&cache[uVar14].cached_bytes + lVar21);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            puVar1 = (undefined8 *)((long)&cache[N - uVar22].cached_bytes + lVar21);
            uVar9 = puVar1[1];
            puVar2 = (undefined8 *)((long)&cache[uVar14].cached_bytes + lVar21);
            *puVar2 = *puVar1;
            puVar2[1] = uVar9;
            puVar1 = (undefined8 *)((long)&cache[N - uVar22].cached_bytes + lVar21);
            *puVar1 = uVar7;
            puVar1[1] = uVar8;
            lVar21 = lVar21 + 0x10;
          } while (uVar22 * 0x10 != lVar21);
        }
        multikey_cache<8u,false>(cache,uVar26,depth);
        multikey_cache<8u,false>(cache + uVar26 + uVar10 + uVar17,uVar24,depth);
        if ((char)uVar11 == '\0') {
          return;
        }
        multikey_cache<8u,true>(cache + uVar26,uVar10 + uVar17,depth + 8);
        return;
      }
      uVar18 = cache[uVar14].cached_bytes;
      puVar3 = cache[uVar14].ptr;
      puVar5 = cache[uVar22].ptr;
      cache[uVar14].cached_bytes = cache[uVar22].cached_bytes;
      cache[uVar14].ptr = puVar5;
      cache[uVar22].cached_bytes = uVar18;
      cache[uVar22].ptr = puVar3;
      uVar14 = uVar14 + 1;
      uVar22 = uVar22 - 1;
    } while( true );
  }
  if (1 < N) {
    uVar10 = N & 0xffffffff;
    pCVar12 = cache;
    do {
      uVar24 = pCVar12[1].cached_bytes;
      puVar3 = pCVar12[1].ptr;
      pCVar12 = pCVar12 + 1;
      pCVar13 = pCVar12;
      while ((cache < pCVar13 && (uVar24 < pCVar13[-1].cached_bytes))) {
        puVar5 = pCVar13[-1].ptr;
        pCVar13->cached_bytes = pCVar13[-1].cached_bytes;
        pCVar13->ptr = puVar5;
        pCVar13 = pCVar13 + -1;
      }
      iVar6 = (int)uVar10;
      pCVar13->cached_bytes = uVar24;
      pCVar13->ptr = puVar3;
      uVar10 = (ulong)(iVar6 - 1);
    } while (2 < iVar6);
    if (N != 1) {
      uVar10 = 1;
      lVar21 = 0;
      lVar20 = 0;
      uVar18 = cache->cached_bytes;
      do {
        lVar20 = lVar20 + 1;
        uVar4 = cache[lVar20].cached_bytes;
        if (uVar18 == uVar4) {
          uVar10 = uVar10 + 1;
        }
        else {
          if ((1 < uVar10) && (1 < (int)uVar10 && (char)cache[lVar21].cached_bytes != '\0')) {
            pCVar12 = cache + lVar21;
            do {
              puVar3 = pCVar12[1].ptr;
              pCVar12 = pCVar12 + 1;
              for (pCVar13 = pCVar12; cache + lVar21 < pCVar13; pCVar13 = pCVar13 + -1) {
                puVar5 = pCVar13[-1].ptr;
                bVar16 = puVar5[depth + 8];
                bVar23 = puVar3[depth + 8];
                if ((bVar16 != 0) && (lVar25 = depth + 9, bVar16 == bVar23)) {
                  do {
                    bVar16 = puVar5[lVar25];
                    bVar23 = puVar3[lVar25];
                    if (bVar16 == 0) break;
                    lVar25 = lVar25 + 1;
                  } while (bVar16 == bVar23);
                }
                if (bVar16 <= bVar23) break;
                pCVar13->ptr = puVar5;
              }
              iVar6 = (int)uVar10;
              pCVar13->ptr = puVar3;
              uVar10 = (ulong)(iVar6 - 1);
            } while (2 < iVar6);
          }
          uVar10 = 1;
          lVar21 = lVar20;
        }
        uVar18 = uVar4;
      } while (lVar20 != N - 1);
      if (((1 < uVar10) && ((char)cache[lVar21].cached_bytes != '\0')) && (1 < (int)uVar10)) {
        pCVar12 = cache + lVar21;
        do {
          puVar3 = pCVar12[1].ptr;
          pCVar12 = pCVar12 + 1;
          for (pCVar13 = pCVar12; cache + lVar21 < pCVar13; pCVar13 = pCVar13 + -1) {
            puVar5 = pCVar13[-1].ptr;
            bVar16 = puVar5[depth + 8];
            bVar23 = puVar3[depth + 8];
            if ((bVar16 != 0) && (lVar20 = depth + 9, bVar16 == bVar23)) {
              do {
                bVar16 = puVar5[lVar20];
                bVar23 = puVar3[lVar20];
                if (bVar16 == 0) break;
                lVar20 = lVar20 + 1;
              } while (bVar16 == bVar23);
            }
            if (bVar16 <= bVar23) break;
            pCVar13->ptr = puVar5;
          }
          iVar6 = (int)uVar10;
          pCVar13->ptr = puVar3;
          uVar10 = (ulong)(iVar6 - 1);
        } while (2 < iVar6);
      }
    }
  }
  return;
}

Assistant:

static void
multikey_cache(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	if (N < 32) {
		if (N==0) return;
		if (CacheDirty) {
			insertion_sort(cache, N, depth);
			return;
		}
		inssort_cache_block(cache, N);
		size_t start=0, cnt=1;
		for (size_t i=0; i < N-1; ++i) {
			if (Cmp()(cache[i], cache[i+1]) == 0) {
				++cnt;
				continue;
			}
			if (cnt > 1 and cache[start].cached_bytes & 0xFF)
				insertion_sort(cache+start, cnt,
						depth+CachedChars);
			cnt = 1;
			start = i+1;
		}
		if (cnt > 1 and cache[start].cached_bytes & 0xFF)
			insertion_sort(cache+start, cnt, depth+CachedChars);
		return;
	}
	if (CacheDirty) {
		fill_cache(cache, N, depth);
	}
	// Move pivot to first position to avoid wrapping the unsigned values
	// we are using in the main loop from zero to max.
	std::swap(cache[0], med3char(
		med3char(cache[0],       cache[N/8],     cache[N/4],    Cmp()),
		med3char(cache[N/2-N/8], cache[N/2],     cache[N/2+N/8],Cmp()),
		med3char(cache[N-1-N/4], cache[N-1-N/8], cache[N-3],    Cmp()),
		Cmp()));
	Cacheblock<CachedChars> partval = cache[0];
	size_t first   = 1;
	size_t last    = N-1;
	size_t beg_ins = 1;
	size_t end_ins = N-1;
	while (true) {
		while (first <= last) {
			const int res = Cmp()(cache[first], partval);
			if (res > 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[beg_ins++], cache[first]);
			}
			++first;
		}
		while (first <= last) {
			const int res = Cmp()(cache[last], partval);
			if (res < 0) {
				break;
			} else if (res == 0) {
				std::swap(cache[end_ins--], cache[last]);
			}
			--last;
		}
		if (first > last)
			break;
		std::swap(cache[first], cache[last]);
		++first;
		--last;
	}
	// Some calculations to make the code more readable.
	const size_t num_eq_beg = beg_ins;
	const size_t num_eq_end = N-1-end_ins;
	const size_t num_eq     = num_eq_beg+num_eq_end;
	const size_t num_lt     = first-beg_ins;
	const size_t num_gt     = end_ins-last;
	// Swap the equal pointers from the beginning to proper position.
	const size_t size1 = std::min(num_eq_beg, num_lt);
	std::swap_ranges(cache, cache+size1, cache+first-size1);
	// Swap the equal pointers from the end to proper position.
	const size_t size2 = std::min(num_eq_end, num_gt);
	std::swap_ranges(cache+first, cache+first+size2, cache+N-size2);
	// Now recurse.
	multikey_cache<CachedChars, false>(cache, num_lt, depth);
	multikey_cache<CachedChars, false>(cache+num_lt+num_eq, num_gt, depth);
	if (partval.cached_bytes & 0xFF)
		multikey_cache<CachedChars, true>(
			cache+num_lt, num_eq, depth+CachedChars);
}